

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vm.cpp
# Opt level: O3

Value __thiscall
jsonnet::internal::anon_unknown_0::Interpreter::makeArray
          (Interpreter *this,
          vector<jsonnet::internal::(anonymous_namespace)::HeapThunk_*,_std::allocator<jsonnet::internal::(anonymous_namespace)::HeapThunk_*>_>
          *v)

{
  unsigned_long uVar1;
  byte bVar2;
  _Rb_tree_node_base *p_Var3;
  long lVar4;
  HeapEntity *pHVar5;
  anon_union_8_3_4e909c26_for_v aVar6;
  anon_union_8_3_4e909c26_for_v extraout_RDX;
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  Value VVar9;
  HeapEntity *local_28;
  
  VVar9._0_8_ = (HeapEntity *)operator_new(0x28);
  (VVar9._0_8_)->type = ARRAY;
  (VVar9._0_8_)->_vptr_HeapEntity = (_func_int **)&PTR__HeapArray_00295700;
  std::
  vector<jsonnet::internal::(anonymous_namespace)::HeapThunk_*,_std::allocator<jsonnet::internal::(anonymous_namespace)::HeapThunk_*>_>
  ::vector((vector<jsonnet::internal::(anonymous_namespace)::HeapThunk_*,_std::allocator<jsonnet::internal::(anonymous_namespace)::HeapThunk_*>_>
            *)(VVar9._0_8_ + 1),v);
  local_28 = VVar9._0_8_;
  std::
  vector<jsonnet::internal::(anonymous_namespace)::HeapEntity_*,_std::allocator<jsonnet::internal::(anonymous_namespace)::HeapEntity_*>_>
  ::push_back(&(this->heap).entities,&local_28);
  bVar2 = (this->heap).lastMark;
  (VVar9._0_8_)->mark = bVar2;
  lVar4 = (long)(this->heap).entities.
                super__Vector_base<jsonnet::internal::(anonymous_namespace)::HeapEntity_*,_std::allocator<jsonnet::internal::(anonymous_namespace)::HeapEntity_*>_>
                ._M_impl.super__Vector_impl_data._M_finish -
          (long)(this->heap).entities.
                super__Vector_base<jsonnet::internal::(anonymous_namespace)::HeapEntity_*,_std::allocator<jsonnet::internal::(anonymous_namespace)::HeapEntity_*>_>
                ._M_impl.super__Vector_impl_data._M_start;
  pHVar5 = (HeapEntity *)(lVar4 >> 3);
  (this->heap).numEntities = (unsigned_long)pHVar5;
  aVar6._4_4_ = 0;
  aVar6._0_4_ = (this->heap).gcTuneMinObjects;
  if ((aVar6.h < pHVar5) &&
     (auVar7._8_4_ = (int)(lVar4 >> 0x23), auVar7._0_8_ = pHVar5, auVar7._12_4_ = 0x45300000,
     uVar1 = (this->heap).lastNumEntities, auVar8._8_4_ = (int)(uVar1 >> 0x20), auVar8._0_8_ = uVar1
     , auVar8._12_4_ = 0x45300000,
     ((auVar8._8_8_ - 1.9342813113834067e+25) +
     ((double)CONCAT44(0x43300000,(int)uVar1) - 4503599627370496.0)) *
     (this->heap).gcTuneGrowthTrigger <
     (auVar7._8_8_ - 1.9342813113834067e+25) +
     ((double)CONCAT44(0x43300000,(int)pHVar5) - 4503599627370496.0))) {
    Heap::markFrom((Heap *)(ulong)bVar2,VVar9._0_8_);
    Stack::mark((Stack *)(this->stack).stack.
                         super__Vector_base<jsonnet::internal::(anonymous_namespace)::Frame,_std::allocator<jsonnet::internal::(anonymous_namespace)::Frame>_>
                         ._M_impl.super__Vector_impl_data._M_start,
                (Heap *)(this->stack).stack.
                        super__Vector_base<jsonnet::internal::(anonymous_namespace)::Frame,_std::allocator<jsonnet::internal::(anonymous_namespace)::Frame>_>
                        ._M_impl.super__Vector_impl_data._M_finish);
    if (((this->scratch).t & ARRAY) != NULL_TYPE) {
      Heap::markFrom((Heap *)(ulong)*(uint *)&(this->heap).lastMark,(this->scratch).v.h);
    }
    for (p_Var3 = (this->cachedImports)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
        (_Rb_tree_header *)p_Var3 != &(this->cachedImports)._M_t._M_impl.super__Rb_tree_header;
        p_Var3 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var3)) {
      if (*(HeapEntity **)(*(long *)(p_Var3 + 3) + 0x40) != (HeapEntity *)0x0) {
        Heap::markFrom((Heap *)(ulong)*(uint *)&(this->heap).lastMark,
                       *(HeapEntity **)(*(long *)(p_Var3 + 3) + 0x40));
      }
    }
    for (p_Var3 = (this->sourceVals)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
        (_Rb_tree_header *)p_Var3 != &(this->sourceVals)._M_t._M_impl.super__Rb_tree_header;
        p_Var3 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var3)) {
      Heap::markFrom((Heap *)(ulong)*(uint *)&(this->heap).lastMark,*(HeapEntity **)(p_Var3 + 2));
    }
    Heap::sweep(&this->heap);
    aVar6 = extraout_RDX;
  }
  VVar9.v.h = aVar6.h;
  return VVar9;
}

Assistant:

Value makeArray(const std::vector<HeapThunk *> &v)
    {
        Value r;
        r.t = Value::ARRAY;
        r.v.h = makeHeap<HeapArray>(v);
        return r;
    }